

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureRandomDataProvider.cc
# Opt level: O0

void __thiscall
SecureRandomDataProvider::provideRandomData(SecureRandomDataProvider *this,uchar *data,size_t len)

{
  size_t __n;
  size_t __ptr;
  int iVar1;
  pointer pFVar2;
  runtime_error *this_00;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_t local_40;
  size_t fr;
  size_t local_20;
  size_t len_local;
  uchar *data_local;
  SecureRandomDataProvider *this_local;
  
  local_20 = len;
  len_local = (size_t)data;
  data_local = (uchar *)this;
  if (provideRandomData(unsigned_char*,unsigned_long)::random_device == '\0') {
    iVar1 = __cxa_guard_acquire(&provideRandomData(unsigned_char*,unsigned_long)::random_device);
    if (iVar1 != 0) {
      provideRandomData::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&provideRandomData::random_device);
      __cxa_atexit(std::unique_ptr<QUtil::FileCloser,_std::default_delete<QUtil::FileCloser>_>::
                   ~unique_ptr,&provideRandomData::random_device,&__dso_handle);
      __cxa_guard_release(&provideRandomData(unsigned_char*,unsigned_long)::random_device);
    }
  }
  __ptr = len_local;
  __n = local_20;
  pFVar2 = std::unique_ptr<QUtil::FileCloser,_std::default_delete<QUtil::FileCloser>_>::operator->
                     (&provideRandomData::random_device);
  local_40 = fread((void *)__ptr,1,__n,(FILE *)pFVar2->f);
  if (local_40 != local_20) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_a0,local_20);
    std::operator+(&local_80,"unable to read ",&local_a0);
    std::operator+(&local_60,&local_80," bytes from random number device");
    std::runtime_error::runtime_error(this_00,(string *)&local_60);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void
SecureRandomDataProvider::provideRandomData(unsigned char* data, size_t len)
{
# if defined(_WIN32)

    // Optimization: make the WindowsCryptProvider static as long as
    // it can be done in a thread-safe fashion.
    WindowsCryptProvider c;
    if (!CryptGenRandom(c.crypt_prov, static_cast<DWORD>(len), reinterpret_cast<BYTE*>(data))) {
        throw std::runtime_error("unable to generate secure random data");
    }

# else
    static std::unique_ptr<QUtil::FileCloser> random_device = []() {
        FILE* f = fopen("/dev/urandom", "rb");
        if (f == nullptr) {
            f = fopen("/dev/arandom", "rb");
        }
        if (f == nullptr) {
            f = fopen("/dev/random", "rb");
        }
        if (f == nullptr) {
            throw std::runtime_error("unable to find device in /dev for generating random numbers");
        }
        return std::make_unique<QUtil::FileCloser>(f);
    }();

    size_t fr = fread(data, 1, len, random_device->f);
    if (fr != len) {
        throw std::runtime_error(
            "unable to read " + std::to_string(len) + " bytes from random number device");
    }

# endif
}